

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseEncodedCharacterString5(CFIReaderImpl *this)

{
  byte bVar1;
  byte bVar2;
  Assimp *this_00;
  uint8_t *data;
  uchar *puVar3;
  byte *pbVar4;
  runtime_error *this_01;
  size_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  CFIReaderImpl *in_RSI;
  ulong len;
  shared_ptr<const_Assimp::FIValue> sVar6;
  _Alloc_hider local_58;
  _Head_base<0UL,_unsigned_char_*,_false> _Stack_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
       (_func_int **)0x0;
  (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  bVar1 = *in_RSI->dataP;
  if ((bVar1 & 8) == 0) {
    data = (uint8_t *)parseNonEmptyOctetString7Length(in_RSI);
    this_00 = (Assimp *)in_RSI->dataP;
    if ((long)data <= (long)in_RSI->dataEnd - (long)this_00) {
      if ((bVar1 & 4) == 0) {
        local_58._M_p = &stack0xffffffffffffffb8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xffffffffffffffa8,this_00,data + (long)this_00);
        puVar3 = (uchar *)operator_new(0x38);
      }
      else {
        if (((ulong)data & 1) != 0) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,(string *)&parseErrorMessage_abi_cxx11_);
          goto LAB_00636a66;
        }
        parseUTF16String_abi_cxx11_((string *)&stack0xffffffffffffffa8,this_00,data,in_RCX);
        puVar3 = (uchar *)operator_new(0x38);
      }
      puVar3[8] = '\x01';
      puVar3[9] = '\0';
      puVar3[10] = '\0';
      puVar3[0xb] = '\0';
      puVar3[0xc] = '\x01';
      puVar3[0xd] = '\0';
      puVar3[0xe] = '\0';
      puVar3[0xf] = '\0';
      *(undefined ***)puVar3 = &PTR___Sp_counted_ptr_inplace_008bff08;
      *(uchar **)(puVar3 + 0x18) = puVar3 + 0x28;
      puVar3[0x20] = '\0';
      puVar3[0x21] = '\0';
      puVar3[0x22] = '\0';
      puVar3[0x23] = '\0';
      puVar3[0x24] = '\0';
      puVar3[0x25] = '\0';
      puVar3[0x26] = '\0';
      puVar3[0x27] = '\0';
      puVar3[0x28] = '\0';
      *(undefined ***)(puVar3 + 0x10) = &PTR_toString_abi_cxx11__008bff58;
      std::__cxx11::string::operator=((string *)(puVar3 + 0x18),(string *)&stack0xffffffffffffffa8);
      (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
           (_func_int **)(puVar3 + 0x10);
      (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar3;
      _Var5._M_pi = extraout_RDX;
      if (local_58._M_p != &stack0xffffffffffffffb8) {
        operator_delete(local_58._M_p);
        _Var5._M_pi = extraout_RDX_00;
      }
LAB_006369da:
      in_RSI->dataP = in_RSI->dataP + (long)data;
      sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Var5._M_pi;
      sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<const_Assimp::FIValue>)
             sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,(string *)&parseErrorMessage_abi_cxx11_);
  }
  else {
    pbVar4 = in_RSI->dataP + 1;
    in_RSI->dataP = pbVar4;
    if ((long)in_RSI->dataEnd - (long)pbVar4 < 1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&parseErrorMessage_abi_cxx11_);
    }
    else {
      bVar2 = *pbVar4;
      data = (uint8_t *)parseNonEmptyOctetString7Length(in_RSI);
      if ((long)data <= (long)in_RSI->dataEnd - (long)in_RSI->dataP) {
        len = (ulong)((uint)(bVar2 >> 2) | (bVar1 & 3) << 6);
        if ((bVar1 & 4) == 0) {
          sVar6 = parseRestrictedAlphabet
                            ((CFIReaderImpl *)&stack0xffffffffffffffa8,(size_t)in_RSI,len);
          _Var5 = sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        }
        else {
          sVar6 = parseEncodedData((CFIReaderImpl *)&stack0xffffffffffffffa8,(size_t)in_RSI,len);
          _Var5 = sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        }
        (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
             (_func_int **)local_58._M_p;
        (this->data)._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Stack_50._M_head_impl;
        goto LAB_006369da;
      }
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&parseErrorMessage_abi_cxx11_);
    }
  }
LAB_00636a66:
  *(undefined ***)this_01 = &PTR__runtime_error_007fc4b8;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<const FIValue> parseEncodedCharacterString5() { // C.20
        std::shared_ptr<const FIValue> result;
        size_t len;
        uint8_t b = *dataP;
        if (b & 0x08) {
            ++dataP;
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            size_t index = ((b & 0x03) << 6) | ((*dataP & 0xfc) >> 2); /* C.29 */
            len = parseNonEmptyOctetString7Length();
            if (dataEnd - dataP < static_cast<ptrdiff_t>(len)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            if (b & 0x04) {
                // encoding algorithm (C.20.3.4)
                result = parseEncodedData(index, len);
            }
            else {
                // Restricted alphabet (C.20.3.3)
                result = parseRestrictedAlphabet(index, len);
            }
        }
        else {
            len = parseNonEmptyOctetString7Length();
            if (dataEnd - dataP < static_cast<ptrdiff_t>(len)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            if (b & 0x04) {
                // UTF-16 (C.20.3.2)
                if (len & 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                result = FIStringValue::create(parseUTF16String(dataP, len));
            }
            else {
                // UTF-8 (C.20.3.1)
                result = FIStringValue::create(parseUTF8String(dataP, len));
            }
        }
        dataP += len;
        return result;
    }